

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<int,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  int iVar1;
  div_t dVar2;
  int *in_RDX;
  int in_EDI;
  int minT;
  int maxT;
  unsigned_long_long tmp;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  int local_30;
  int local_2c;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  div_t local_20;
  int *local_18;
  int local_10;
  
  local_18 = in_RDX;
  local_10 = in_EDI;
  iVar1 = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffffc0);
  dVar2 = division_negative_negateU<int,_unsigned_long_long,_true>::div(iVar1,local_10);
  local_20 = dVar2;
  iVar1 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar1 < (ulong)dVar2) {
    local_2c = std::numeric_limits<int>::max();
    if (local_20 != (div_t)((long)local_2c + 1)) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    local_30 = std::numeric_limits<int>::min();
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_34,&local_30)
    ;
    *local_18 = local_34.m_int;
  }
  else {
    local_28 = (local_20.quot ^ 0xffffffffU) + 1;
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_24,&local_28)
    ;
    *local_18 = local_24.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }